

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jobs.cpp
# Opt level: O3

bool __thiscall
JsUtil::BackgroundJobProcessor::WaitWithThread
          (BackgroundJobProcessor *this,ParallelThreadData *parallelThreadData,Event *e,
          uint milliseconds)

{
  DWORD DVar1;
  HANDLE local_28;
  HANDLE handles [2];
  
  local_28 = e->handle;
  handles[0] = parallelThreadData->threadHandle;
  DVar1 = WaitForMultipleObjectsEx
                    ((this->threadService->threadService == (ThreadServiceCallback)0x0) + 1,
                     &local_28,0,milliseconds,0);
  if (DVar1 < 2) {
    if (DVar1 == 1) {
      parallelThreadData->isWaitingForJobs = false;
    }
  }
  else if ((milliseconds == 0xffffffff) || (DVar1 != 0x102)) {
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
  return DVar1 == 0;
}

Assistant:

bool BackgroundJobProcessor::WaitWithThread(ParallelThreadData *parallelThreadData, const Event &e, const unsigned int milliseconds)
    {
        const HANDLE handles[] = { e.Handle(), parallelThreadData->threadHandle };

        // If we have a thread service, then only wait on the event, not the actual thread handle.
        DWORD handleCount = 2;
        if (threadService->HasCallback())
        {
            handleCount = 1;
        }

        const unsigned int result = WaitForMultipleObjectsEx(handleCount, handles, false, milliseconds, false);

        if (!(result == WAIT_OBJECT_0 || result == WAIT_OBJECT_0 + 1 || (result == WAIT_TIMEOUT && milliseconds != INFINITE)))
        {
            Js::Throw::FatalInternalError();
        }

        if (result == WAIT_OBJECT_0 + 1)
        {
            // Apparently, sometimes the thread dies while waiting for an event. It should only be during process shutdown but
            // we can't know because DLL_PROCESS_DETACH may not have been called yet, which is bizarre. It seems unclear why
            // this happens and this could cause unpredictable behavior since the behavior of this object is undefined if the
            // thread is killed arbitrarily, or if there are incoming calls after Close. In any case, uses of this function have
            // been ported from BackgroundCodeGenThread. For now, we assume that Close will be called eventually and set the
            // state to what it should be before Close is called.
            parallelThreadData->isWaitingForJobs = false;
        }

        return result == WAIT_OBJECT_0;

    }